

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdJoin.cpp
# Opt level: O1

int CmdJoin(CLI *cli,Rules *rules,Database *database,Journal *journal)

{
  pointer pcVar1;
  pointer pIVar2;
  Database *this;
  pointer pIVar3;
  bool verbose;
  bool bVar4;
  _Rb_tree_node_base *p_Var5;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar6;
  _Base_ptr p_Var7;
  ostream *poVar8;
  string *__return_storage_ptr__;
  string *psVar9;
  long lVar10;
  pointer pIVar11;
  _Rb_tree_header *p_Var12;
  Datetime *pDVar13;
  undefined8 *puVar14;
  undefined8 *puVar15;
  iterator __end3;
  byte bVar16;
  vector<Interval,_std::allocator<Interval>_> intervals;
  Interval first;
  set<int,_std::less<int>,_std::allocator<int>_> ids;
  Interval combined;
  Interval second;
  IntervalFilterAllWithIds filtering;
  char local_359;
  Journal *local_358;
  CLI *local_350;
  Rules *local_348;
  Database *local_340;
  vector<Interval,_std::allocator<Interval>_> local_338;
  undefined1 local_320 [56];
  Datetime local_2e8;
  int local_2b8;
  bool local_2b4;
  _Alloc_hider local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_290;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_260;
  undefined1 local_230 [112];
  _Alloc_hider local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_170;
  undefined1 local_140 [112];
  _Alloc_hider local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_b0;
  IntervalFilterAllWithIds local_80;
  
  bVar16 = 0;
  local_320._0_8_ = local_320 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"verbose","");
  verbose = Rules::getBoolean(rules,(string *)local_320,false);
  if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
  }
  CLI::getIds((set<int,_std::less<int>,_std::allocator<int>_> *)&local_260,cli);
  if (local_260._M_impl.super__Rb_tree_header._M_node_count != 2) {
    psVar9 = (string *)__cxa_allocate_exception(0x20);
    *(string **)psVar9 = psVar9 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              (psVar9,"Two IDs must be specified. See \'timew help join\'.","");
    __cxa_throw(psVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  Journal::startTransaction(journal);
  flattenDatabase(database,rules);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            (&local_170,&local_260);
  IntervalFilterAllWithIds::IntervalFilterAllWithIds
            (&local_80,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_170);
  local_358 = journal;
  local_350 = cli;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_170);
  local_348 = rules;
  local_340 = database;
  getTracked(&local_338,database,rules,&local_80.super_IntervalFilter);
  pIVar3 = local_338.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (((long)local_338.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_338.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
             super__Vector_impl_data._M_start >> 6) * -0x5555555555555555 -
      local_260._M_impl.super__Rb_tree_header._M_node_count != 0) {
    for (p_Var5 = local_260._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &local_260._M_impl.super__Rb_tree_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      if (pIVar3 == local_338.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
LAB_00142ec0:
        __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
        local_320._0_8_ = local_320 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_320,"ID \'@{1}\' does not correspond to any tracking.","");
        format<int>(__return_storage_ptr__,1,(string *)local_320,p_Var5[1]._M_color);
        __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                    std::__cxx11::string::~string);
      }
      bVar4 = false;
      pIVar2 = pIVar3;
      do {
        pIVar11 = pIVar2 + 1;
        if (pIVar2->id == p_Var5[1]._M_color) {
          bVar4 = true;
          break;
        }
        pIVar2 = pIVar11;
      } while (pIVar11 !=
               local_338.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
               super__Vector_impl_data._M_finish);
      if (!bVar4) goto LAB_00142ec0;
    }
  }
  pDVar13 = &pIVar3[1].super_Range.start;
  puVar14 = (undefined8 *)(local_320 + 8);
  for (lVar10 = 0xc; lVar10 != 0; lVar10 = lVar10 + -1) {
    *puVar14 = *(undefined8 *)pDVar13;
    pDVar13 = (Datetime *)((long)pDVar13 + (ulong)bVar16 * -0x10 + 8);
    puVar14 = puVar14 + (ulong)bVar16 * -2 + 1;
  }
  local_320._0_8_ = &PTR__Interval_001a16e8;
  local_2b8 = pIVar3[1].id;
  local_2b4 = pIVar3[1].synthetic;
  local_2b0._M_p = (pointer)&local_2a0;
  pcVar1 = pIVar3[1].annotation._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b0,pcVar1,pcVar1 + pIVar3[1].annotation._M_string_length);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&local_290,&pIVar3[1]._tags._M_t);
  pDVar13 = &((local_338.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
               super__Vector_impl_data._M_start)->super_Range).start;
  puVar14 = (undefined8 *)(local_140 + 8);
  for (lVar10 = 0xc; lVar10 != 0; lVar10 = lVar10 + -1) {
    *puVar14 = *(undefined8 *)pDVar13;
    pDVar13 = (Datetime *)((long)pDVar13 + (ulong)bVar16 * -0x10 + 8);
    puVar14 = puVar14 + (ulong)bVar16 * -2 + 1;
  }
  local_140._0_8_ = &PTR__Interval_001a16e8;
  local_140._104_4_ =
       (local_338.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
        super__Vector_impl_data._M_start)->id;
  local_140[0x6c] =
       (local_338.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
        super__Vector_impl_data._M_start)->synthetic;
  local_d0._M_p = (pointer)&local_c0;
  pcVar1 = ((local_338.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
             super__Vector_impl_data._M_start)->annotation)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar1,
             pcVar1 + ((local_338.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                        super__Vector_impl_data._M_start)->annotation)._M_string_length);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&_Stack_b0,
             &((local_338.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                super__Vector_impl_data._M_start)->_tags)._M_t);
  puVar14 = (undefined8 *)(local_140 + 8);
  puVar15 = (undefined8 *)(local_230 + 8);
  for (lVar10 = 0xc; lVar10 != 0; lVar10 = lVar10 + -1) {
    *puVar15 = *puVar14;
    puVar14 = puVar14 + (ulong)bVar16 * -2 + 1;
    puVar15 = puVar15 + (ulong)bVar16 * -2 + 1;
  }
  local_230._0_8_ = &PTR__Interval_001a16e8;
  local_230._104_4_ = local_140._104_4_;
  local_230[0x6c] = local_140[0x6c];
  local_1c0._M_p = (pointer)&local_1b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c0,local_d0._M_p,local_d0._M_p + local_c8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&local_1a0,&_Stack_b0);
  local_230._88_8_ = local_2e8._32_8_;
  local_230._96_8_ = local_2e8._date;
  local_230._72_4_ = local_2e8._julian;
  local_230._76_4_ = local_2e8._day;
  local_230._80_4_ = local_2e8._seconds;
  local_230._84_4_ = local_2e8._offset;
  local_230._56_4_ = local_2e8._year;
  local_230._60_4_ = local_2e8._month;
  local_230._64_4_ = local_2e8._week;
  local_230._68_4_ = local_2e8._weekday;
  psVar6 = Interval::tags_abi_cxx11_((Interval *)local_320);
  p_Var7 = (psVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var12 = &(psVar6->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var12) {
    do {
      Interval::tag((Interval *)local_230,(string *)(p_Var7 + 1));
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var12);
  }
  this = local_340;
  Database::deleteInterval(local_340,(Interval *)local_320);
  Database::deleteInterval(this,(Interval *)local_140);
  validate(local_350,local_348,this,(Interval *)local_230);
  Database::addInterval(this,(Interval *)local_230,verbose);
  Journal::endTransaction(local_358);
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Joined @",8);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_2b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," and @",6);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_140._104_4_);
    local_359 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,&local_359,1);
  }
  local_230._0_8_ = &PTR__Interval_001a16e8;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_p != &local_1b0) {
    operator_delete(local_1c0._M_p,local_1b0._M_allocated_capacity + 1);
  }
  local_140._0_8_ = &PTR__Interval_001a16e8;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&_Stack_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_p != &local_c0) {
    operator_delete(local_d0._M_p,local_c0._M_allocated_capacity + 1);
  }
  local_320._0_8_ = &PTR__Interval_001a16e8;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_290);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_p != &local_2a0) {
    operator_delete(local_2b0._M_p,local_2a0._M_allocated_capacity + 1);
  }
  std::vector<Interval,_std::allocator<Interval>_>::~vector(&local_338);
  local_80.super_IntervalFilter._vptr_IntervalFilter = (_func_int **)&PTR_accepts_001a1980;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_80._ids._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_260);
  return 0;
}

Assistant:

int CmdJoin (
  CLI& cli,
  Rules& rules,
  Database& database,
  Journal& journal)
{
  const bool verbose = rules.getBoolean ("verbose");

  // Gather IDs and TAGs.
  auto ids = cli.getIds ();

  // Only 2 IDs allowed in a join.
  if (ids.size () != 2)
  {
    throw std::string ("Two IDs must be specified. See 'timew help join'.");
  }

  journal.startTransaction ();

  flattenDatabase (database, rules);
  auto filtering = IntervalFilterAllWithIds (ids);
  auto intervals = getTracked (database, rules, filtering);

  if (intervals.size () != ids.size ())
  {
    for (auto& id: ids)
    {
      bool found = false;

      for (auto& interval: intervals)
      {
        if (interval.id == id)
        {
          found = true;
          break;
        }
      }
      if (! found)
      {
        throw format ("ID '@{1}' does not correspond to any tracking.", id);
      }
    }
  }

  Interval first  = intervals[1];
  Interval second = intervals[0];

  // TODO Require confirmation if intervals are not consecutive.

  auto combined = second;
  combined.end = first.end;

  for (auto& tag: first.tags ())
  {
    combined.tag (tag);
  }

  database.deleteInterval (first);
  database.deleteInterval (second);

  validate (cli, rules, database, combined);
  database.addInterval (combined, verbose);

  journal.endTransaction ();

  if (verbose)
  {
    std::cout << "Joined @" << first.id << " and @" << second.id << '\n';
  }

  return 0;
}